

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkUniversal::IntFromDescriptor
          (ChLinkUniversal *this,uint off_v,ChStateDelta *v,uint off_L,ChVectorDynamic<> *L)

{
  ulong uVar1;
  double *pdVar2;
  int iVar3;
  undefined4 in_register_00000034;
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])
                    (this,CONCAT44(in_register_00000034,off_v));
  if ((char)iVar3 == '\0') {
    return;
  }
  uVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < (long)uVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[off_L] = (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.l_i;
    if (off_L + 1 < uVar1) {
      pdVar2[off_L + 1] = (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.l_i;
      if (off_L + 2 < uVar1) {
        pdVar2[off_L + 2] = (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.l_i;
        if (off_L + 3 < uVar1) {
          pdVar2[off_L + 3] = (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.l_i;
          return;
        }
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkUniversal::IntFromDescriptor(const unsigned int off_v,
                                        ChStateDelta& v,
                                        const unsigned int off_L,
                                        ChVectorDynamic<>& L) {
    if (!IsActive())
        return;

    L(off_L + 0) = m_cnstr_x.Get_l_i();
    L(off_L + 1) = m_cnstr_y.Get_l_i();
    L(off_L + 2) = m_cnstr_z.Get_l_i();
    L(off_L + 3) = m_cnstr_dot.Get_l_i();
}